

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DDLNode.cpp
# Opt level: O2

void __thiscall ODDLParser::DDLNode::~DDLNode(DDLNode *this)

{
  Property *this_00;
  Value *this_01;
  Reference *this_02;
  DataArrayList *this_03;
  pointer ppDVar1;
  DDLNode *this_04;
  size_t i;
  ulong uVar2;
  
  this_00 = this->m_properties;
  if (this_00 != (Property *)0x0) {
    Property::~Property(this_00);
  }
  operator_delete(this_00);
  this_01 = this->m_value;
  if (this_01 != (Value *)0x0) {
    Value::~Value(this_01);
  }
  operator_delete(this_01);
  this_02 = this->m_references;
  if (this_02 != (Reference *)0x0) {
    Reference::~Reference(this_02);
    operator_delete(this_02);
  }
  this_03 = this->m_dtArrayList;
  if (this_03 != (DataArrayList *)0x0) {
    DataArrayList::~DataArrayList(this_03);
  }
  operator_delete(this_03);
  this->m_dtArrayList = (DataArrayList *)0x0;
  if (*(DDLNode **)(s_allocatedNodes + this->m_idx * 8) == this) {
    *(undefined8 *)(s_allocatedNodes + this->m_idx * 8) = 0;
  }
  for (uVar2 = 0;
      ppDVar1 = (this->m_children).
                super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->m_children).
                            super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar1 >> 3);
      uVar2 = uVar2 + 1) {
    this_04 = ppDVar1[uVar2];
    if (this_04 != (DDLNode *)0x0) {
      ~DDLNode(this_04);
    }
    operator_delete(this_04);
  }
  std::_Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::~_Vector_base
            (&(this->m_children).
              super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>);
  std::__cxx11::string::~string((string *)&this->m_name);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

DDLNode::~DDLNode() {
    delete m_properties;
    delete m_value;
    releaseReferencedNames( m_references );

    delete m_dtArrayList;
    m_dtArrayList = ddl_nullptr;
    if( s_allocatedNodes[ m_idx ] == this ) {
        s_allocatedNodes[ m_idx ] = ddl_nullptr;
    }
    for ( size_t i = 0; i<m_children.size(); i++ ){
        delete m_children[ i ];
    }
}